

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O1

int __thiscall Client::do_recv(Client *this,int fd)

{
  char **ppcVar1;
  ssize_t sVar2;
  int *piVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  char **ppcVar7;
  Client *this_00;
  int iVar8;
  ulong uVar9;
  int iVar10;
  Client *this_01;
  uint uVar11;
  int local_34;
  
  this_01 = (Client *)(ulong)(uint)fd;
  iVar8 = this->_sock_fd;
  ppcVar7 = &(this->_sock2stdout)._r_pos;
  if (((iVar8 == fd) && (ppcVar7 == (char **)(this->_sock2stdout)._r_pos)) ||
     ((ppcVar1 = &(this->_stdin2sock)._r_pos, fd == 0 &&
      (ppcVar1 == (char **)(this->_stdin2sock)._r_pos)))) {
    if (iVar8 != fd) {
      if (fd != 0) {
        return -6;
      }
      do_recv();
      return -6;
    }
LAB_0010209f:
    do_recv();
    return -6;
  }
  uVar9 = (ulong)CONCAT31((int3)((uint)fd >> 8),iVar8 == fd || fd == 0);
  if (iVar8 == fd || fd == 0) {
    if (iVar8 != fd) {
      iVar8 = 0;
      ppcVar7 = ppcVar1;
    }
    sVar2 = read(iVar8,*ppcVar7,(long)ppcVar7 - (long)*ppcVar7);
    uVar11 = (uint)sVar2;
    if (-1 < (int)uVar11) {
      if (uVar11 != 0) {
        fprintf(_stderr,"%s(%d)-<%s>: read done from fd: %d, total nbytes: %d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
                ,0xc6,"do_recv",this_01,uVar11);
        fflush(_stderr);
        if (this->_sock_fd == fd) {
          ppcVar7 = &(this->_sock2stdout)._r_pos;
          *ppcVar7 = *ppcVar7 + (uVar11 & 0x7fffffff);
          return 0;
        }
        if (fd != 0) {
          return 0;
        }
        ppcVar7 = &(this->_stdin2sock)._r_pos;
        *ppcVar7 = *ppcVar7 + (uVar11 & 0x7fffffff);
        return 0;
      }
      if (this->_sock_fd == fd) {
        do_recv(this);
        return -1;
      }
      if (fd != 0) {
        return 0;
      }
      do_recv();
      return local_34;
    }
    piVar3 = __errno_location();
    if (*piVar3 == 0xb) {
      return 0;
    }
    do_recv();
    goto LAB_0010209f;
  }
  do_recv(this_01);
  iVar8 = (int)uVar9;
  this_00 = (Client *)(uVar9 & 0xffffffff);
  if (iVar8 == 1) {
    pcVar5 = (this_01->_sock2stdout)._r_pos;
    pcVar4 = (this_01->_sock2stdout)._w_pos;
    if (pcVar5 == pcVar4) goto LAB_001021ab;
    lVar6 = 0x1060;
    iVar10 = 1;
LAB_0010219a:
    sVar2 = write(iVar10,*(void **)((this_01->_stdin2sock)._buf + lVar6 + -0x48),
                  (long)pcVar5 - (long)pcVar4);
    uVar11 = (uint)sVar2;
  }
  else {
    if (this_01->_sock_fd != iVar8) goto LAB_001022c4;
    pcVar5 = (this_01->_stdin2sock)._r_pos;
    pcVar4 = (this_01->_stdin2sock)._w_pos;
    lVar6 = 0x850;
    iVar10 = iVar8;
    if (pcVar5 != pcVar4) goto LAB_0010219a;
LAB_001021ab:
    uVar11 = 0;
  }
  if ((int)uVar11 < 0) {
    piVar3 = __errno_location();
    iVar10 = 0;
    if (*piVar3 != 0xb) {
      do_send();
LAB_001022c4:
      do_send(this_00);
      if ((this_00->_epoll)._maxevents < iVar8) {
        Epoll::get();
        halt_baddata();
      }
      return iVar8 * 0xc + (int)(this_00->_epoll)._events;
    }
  }
  else {
    iVar10 = 0;
    fprintf(_stderr,"%s(%d)-<%s>: send fd: %d done, total nbteys: %d\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Client.cpp"
            ,0xf5,"do_send",this_00,uVar11);
    fflush(_stderr);
    if (iVar8 == 1) {
      pcVar5 = (this_01->_sock2stdout)._w_pos + uVar11;
      (this_01->_sock2stdout)._w_pos = pcVar5;
      if ((this_01->_sock2stdout)._r_pos == pcVar5) {
        (this_01->_sock2stdout)._r_pos = (this_01->_sock2stdout)._buf;
        (this_01->_sock2stdout)._w_pos = (this_01->_sock2stdout)._buf;
      }
      if ((this_01->_stdineof == true) &&
         ((this_01->_sock2stdout)._r_pos == (this_01->_sock2stdout)._w_pos)) {
        shutdown(this_01->_sock_fd,0);
        iVar10 = -7;
      }
    }
    else if ((this_01->_sock_fd == iVar8) &&
            (pcVar5 = (this_01->_stdin2sock)._w_pos + uVar11, (this_01->_stdin2sock)._w_pos = pcVar5
            , (this_01->_stdin2sock)._r_pos == pcVar5)) {
      (this_01->_stdin2sock)._r_pos = (this_01->_stdin2sock)._buf;
      (this_01->_stdin2sock)._w_pos = (this_01->_stdin2sock)._buf;
    }
  }
  return iVar10;
}

Assistant:

int Client::do_recv(int fd)
{
    int nrecv;

    if ((fd == _sock_fd && _sock2stdout.left_size() == 0) ||
        (fd == STDIN_FILENO && _stdin2sock.left_size() == 0))
    {
        if (fd == _sock_fd)
        {
            LOG_PRINT("sock_fd can read, but _sock2stdout have no empty space to read!");
        }
        else if (fd == STDIN_FILENO)
        {
            LOG_PRINT("stdin can read, buf _stdin2sock have no empty space to read!")
        }

        return err_clt_recv_nospace;
    }


    if (fd == _sock_fd)
    {
        nrecv = read(_sock_fd, _sock2stdout._r_pos, _sock2stdout.left_size());
    }
    else if (fd == STDIN_FILENO)
    {
        nrecv = read(STDIN_FILENO, _stdin2sock._r_pos, _stdin2sock.left_size());
    }
    else
    {
        LOG_PRINT("unknown fd: %d", fd);
        exit(err_clt_recv_unknown_fd);
    }

    if (nrecv < 0)
    {
        if (errno != EAGAIN)    //也就是 EWOULDBLOCK
        {
            LOG_PRINT("recv fd:%d occurs error, error %s", fd, strerror(errno));
            exit(err_clt_recv_error);

        }
    }
    else if (nrecv == 0)
    {
        if (fd == _sock_fd)
        {
            LOG_PRINT("read EOF on sock");
            if (_stdineof)
            {
                LOG_PRINT("EOF on sock after EOF on stdin, so disconnect to server[%s:%d]", _svr_ip.c_str(), _svr_port);
                return err_clt_recv_disconn;
            }
            else 
            {
                LOG_PRINT("server[%s:%d] terminated prematurely", _svr_ip.c_str(), _svr_port);
                exit(err_clt_recv_svrcrash);
            }
        }
        else if (fd == STDIN_FILENO)
        {
            LOG_PRINT("read EOF on stdin");
            _stdineof = true;
            if (_stdin2sock.data_size() == 0)
            {
                LOG_PRINT("EOF on stdin and no data to send sock, so shutdown sock write side");
                shutdown(_sock_fd, SHUT_WR);
                return err_clt_recv_shutdown_wr;
            }
        }
    }
    else
    {
        LOG_PRINT("read done from fd: %d, total nbytes: %d", fd, nrecv);
        if (fd == _sock_fd)
        {
            _sock2stdout.set_r_pow(nrecv);
        }
        else if (fd == STDIN_FILENO)
        {
            _stdin2sock.set_r_pow(nrecv);
        }
        return err_clt_recv_normal;
    }
    return err_clt_recv_normal;
}